

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::internal::DecodeNetDiagData
                  (Error *__return_storage_ptr__,NetDiagData *aNetDiagData,ByteArray *aPayload)

{
  ErrorCode EVar1;
  Error *pEVar2;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ByteArray *pBVar4;
  _List_node_base *p_Var5;
  mapped_type mode;
  mapped_type extMacAddr;
  TlvSet tlvSet;
  TlvList tlvList;
  NetDiagData diagData;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tlvSet._M_t._M_impl.super__Rb_tree_header._M_header;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tlvList.super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&tlvList;
  tlvList.super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>.
  _M_impl._M_node._M_size = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  diagData.mMode.mIsRxOnWhenIdleMode = false;
  diagData.mMode.mIsMtd = false;
  diagData.mMode.mIsStableNetworkDataRequired = false;
  diagData.mRoute64.mIdSequence = '\0';
  diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mMacAddr = 0;
  diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mLeaderData.mPartitionId = 0;
  diagData.mLeaderData.mWeighting = '\0';
  diagData.mLeaderData.mDataVersion = '\0';
  diagData.mLeaderData.mStableDataVersion = '\0';
  diagData.mLeaderData.mRouterId = '\0';
  diagData.mMacCounters.mIfInUnknownProtos = 0;
  diagData.mMacCounters.mIfInErrors = 0;
  diagData.mMacCounters.mIfOutErrors = 0;
  diagData.mMacCounters.mIfInUcastPkts = 0;
  diagData.mMacCounters.mIfInBroadcastPkts = 0;
  diagData.mMacCounters.mIfInDiscards = 0;
  diagData.mMacCounters.mIfOutUcastPkts = 0;
  diagData.mMacCounters.mIfOutBroadcastPkts = 0;
  diagData.mMacCounters.mIfOutDiscards = 0;
  diagData.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mPresentFlags = 0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tlvList.super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       tlvList.
       super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  tlv::GetTlvSet((Error *)&extMacAddr,&tlvSet,aPayload,kNetworkDiag);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string
            ((string *)
             &extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (EVar1 != kNone) goto LAB_00150eeb;
  mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0;
  p_Var3 = &std::
            map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
            ::operator[](&tlvSet,(key_type *)&mode)->
            super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
             p_Var3);
  if ((Tlv *)CONCAT71(extMacAddr.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      extMacAddr.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._0_1_) != (Tlv *)0x0) {
    pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(extMacAddr.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._1_7_,
                                                extMacAddr.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_1_));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&diagData.mExtMacAddr,pBVar4);
    diagData.mPresentFlags = diagData.mPresentFlags | 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 1;
  p_Var3 = &std::
            map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
            ::operator[](&tlvSet,(key_type *)&mode)->
            super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
             p_Var3);
  if ((Tlv *)CONCAT71(extMacAddr.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      extMacAddr.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._0_1_) != (Tlv *)0x0) {
    pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(extMacAddr.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._1_7_,
                                                extMacAddr.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_1_));
    diagData.mMacAddr = utils::Decode<unsigned_short>(pBVar4);
    diagData.mPresentFlags = diagData.mPresentFlags | 2;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
       = 2;
  p_Var3 = &std::
            map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
            ::operator[](&tlvSet,(key_type *)&extMacAddr)->
            super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,p_Var3
            );
  if ((Tlv *)CONCAT71(mode.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      mode.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._0_1_) == (Tlv *)0x0) {
LAB_00150ca3:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_1_ = 5;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&extMacAddr)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    if ((Tlv *)CONCAT71(mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      DecodeRoute64((Error *)&extMacAddr,&diagData.mRoute64,pBVar4);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string
                ((string *)
                 &extMacAddr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (EVar1 != kNone) goto LAB_00150ee1;
      diagData.mPresentFlags = diagData.mPresentFlags | 8;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_1_ = 6;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&extMacAddr)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    if ((Tlv *)CONCAT71(mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      DecodeLeaderData((Error *)&extMacAddr,&diagData.mLeaderData,pBVar4);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string
                ((string *)
                 &extMacAddr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (EVar1 != kNone) goto LAB_00150ee1;
      diagData.mPresentFlags = diagData.mPresentFlags | 0x10;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_1_ = 8;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&extMacAddr)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    if ((Tlv *)CONCAT71(mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      DecodeIpv6AddressList((Error *)&extMacAddr,&diagData.mAddrs,pBVar4);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string
                ((string *)
                 &extMacAddr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (EVar1 != kNone) goto LAB_00150ee1;
      diagData.mPresentFlags = diagData.mPresentFlags | 0x20;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_1_ = 9;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&extMacAddr)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    if ((Tlv *)CONCAT71(mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      DecodeMacCounters((Error *)&extMacAddr,&diagData.mMacCounters,pBVar4);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string
                ((string *)
                 &extMacAddr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (EVar1 != kNone) goto LAB_00150ee1;
      diagData.mPresentFlags = diagData.mPresentFlags | 0x100;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
    _0_1_ = 0x10;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&extMacAddr)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    if ((Tlv *)CONCAT71(mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        mode.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  mode.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      DecodeChildTable((Error *)&extMacAddr,&diagData.mChildTable,pBVar4);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string
                ((string *)
                 &extMacAddr.
                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (EVar1 != kNone) goto LAB_00150ee1;
      diagData.mPresentFlags = diagData.mPresentFlags | 0x40;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
         0x17;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[](&tlvSet,(key_type *)&mode)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&extMacAddr.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    if ((Tlv *)CONCAT71(extMacAddr.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._1_7_,
                        extMacAddr.
                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._0_1_) != (Tlv *)0x0) {
      pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(extMacAddr.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._1_7_,
                                                  extMacAddr.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_1_));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&diagData.mEui64,pBVar4)
      ;
      diagData.mPresentFlags = diagData.mPresentFlags | 0x80;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&extMacAddr.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    tlv::GetTlvListByType
              ((Error *)&extMacAddr,&tlvList,aPayload,kNetworkDiagChildIpv6Address,kNetworkDiag);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string
              ((string *)
               &extMacAddr.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (EVar1 == kNone) {
      if (tlvList.
          super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>.
          _M_impl._M_node._M_size == 0) {
LAB_00151026:
        NetDiagData::operator=(aNetDiagData,&diagData);
      }
      else {
        p_Var5 = (_List_node_base *)&tlvList;
        do {
          p_Var5 = (((_List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                      *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var5 == (_List_node_base *)&tlvList) {
            diagData.mPresentFlags = diagData.mPresentFlags | 0x200;
            goto LAB_00151026;
          }
          pBVar4 = tlv::Tlv::GetValue((Tlv *)(p_Var5 + 1));
          DecodeChildIpv6AddressList((Error *)&extMacAddr,&diagData.mChildIpv6AddrsInfoList,pBVar4);
          pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
          EVar1 = pEVar2->mCode;
          std::__cxx11::string::~string
                    ((string *)
                     &extMacAddr.
                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        } while (EVar1 == kNone);
      }
    }
  }
  else {
    pBVar4 = tlv::Tlv::GetValue((Tlv *)CONCAT71(mode.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._1_7_,
                                                mode.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._0_1_));
    DecodeModeData((Error *)&extMacAddr,&diagData.mMode,pBVar4);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)&extMacAddr);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string
              ((string *)
               &extMacAddr.
                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (EVar1 == kNone) {
      diagData.mPresentFlags = diagData.mPresentFlags | 4;
      goto LAB_00150ca3;
    }
LAB_00150ee1:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_00150eeb:
  NetDiagData::~NetDiagData(&diagData);
  std::__cxx11::_List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
  ::_M_clear(&tlvList.
              super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
            );
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&tlvSet._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeNetDiagData(NetDiagData &aNetDiagData, const ByteArray &aPayload)
{
    Error        error;
    tlv::TlvSet  tlvSet;
    tlv::TlvList tlvList;
    NetDiagData  diagData;

    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aPayload, tlv::Scope::kNetworkDiag));

    if (auto extMacAddr = tlvSet[tlv::Type::kNetworkDiagExtMacAddress])
    {
        const ByteArray &value = extMacAddr->GetValue();
        diagData.mExtMacAddr   = value;
        diagData.mPresentFlags |= NetDiagData::kExtMacAddrBit;
    }

    if (auto macAddr = tlvSet[tlv::Type::kNetworkDiagMacAddress])
    {
        uint16_t value;
        value             = utils::Decode<uint16_t>(macAddr->GetValue());
        diagData.mMacAddr = value;
        diagData.mPresentFlags |= NetDiagData::kMacAddrBit;
    }

    if (auto mode = tlvSet[tlv::Type::kNetworkDiagMode])
    {
        SuccessOrExit(error = internal::DecodeModeData(diagData.mMode, mode->GetValue()));
        diagData.mPresentFlags |= NetDiagData::kModeBit;
    }

    if (auto route64 = tlvSet[tlv::Type::kNetworkDiagRoute64])
    {
        const ByteArray &value = route64->GetValue();
        SuccessOrExit(error = DecodeRoute64(diagData.mRoute64, value));
        diagData.mPresentFlags |= NetDiagData::kRoute64Bit;
    }

    if (auto leaderData = tlvSet[tlv::Type::kNetworkDiagLeaderData])
    {
        const ByteArray &value = leaderData->GetValue();
        SuccessOrExit(error = DecodeLeaderData(diagData.mLeaderData, value));
        diagData.mPresentFlags |= NetDiagData::kLeaderDataBit;
    }

    if (auto ipv6Addrs = tlvSet[tlv::Type::kNetworkDiagIpv6Address])
    {
        const ByteArray &value = ipv6Addrs->GetValue();
        SuccessOrExit(error = DecodeIpv6AddressList(diagData.mAddrs, value));
        diagData.mPresentFlags |= NetDiagData::kAddrsBit;
    }

    if (auto macCounters = tlvSet[tlv::Type::kNetworkDiagMacCounters])
    {
        const ByteArray &value = macCounters->GetValue();
        SuccessOrExit(error = DecodeMacCounters(diagData.mMacCounters, value));
        diagData.mPresentFlags |= NetDiagData::kMacCountersBit;
    }

    if (auto childTable = tlvSet[tlv::Type::kNetworkDiagChildTable])
    {
        const ByteArray &value = childTable->GetValue();
        SuccessOrExit(error = DecodeChildTable(diagData.mChildTable, value));
        diagData.mPresentFlags |= NetDiagData::kChildTableBit;
    }

    if (auto eui64 = tlvSet[tlv::Type::kNetworkDiagEui64])
    {
        const ByteArray &value = eui64->GetValue();
        diagData.mEui64        = value;
        diagData.mPresentFlags |= NetDiagData::kEui64Bit;
    }

    SuccessOrExit(error = tlv::GetTlvListByType(tlvList, aPayload, tlv::Type::kNetworkDiagChildIpv6Address,
                                                tlv::Scope::kNetworkDiag));

    if (tlvList.size() > 0)
    {
        for (const auto &tlv : tlvList)
        {
            SuccessOrExit(error = DecodeChildIpv6AddressList(diagData.mChildIpv6AddrsInfoList, tlv.GetValue()));
        }
        diagData.mPresentFlags |= NetDiagData::kChildIpv6AddrsInfoListBit;
    }

    aNetDiagData = diagData;

exit:
    return error;
}